

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O3

void __thiscall
wasm::ModuleUtils::CallGraphPropertyAnalysis<Info>::CallGraphPropertyAnalysis
          (CallGraphPropertyAnalysis<Info> *this,Module *wasm,Func *work)

{
  size_t *__dest;
  char **ppcVar1;
  mapped_type *pmVar2;
  _Rb_tree_node_base *p_Var3;
  Function *pFVar4;
  Map *__range3;
  undefined1 local_a0 [8];
  ParallelFunctionAnalysis<Info,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap> analysis;
  key_type local_48;
  Function *target;
  Function *local_38;
  
  this->wasm = wasm;
  local_38 = (Function *)&(this->map)._M_t._M_impl.super__Rb_tree_header;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_38;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)local_38;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)work;
  ParallelFunctionAnalysis<Info,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>::
  ParallelFunctionAnalysis
            ((ParallelFunctionAnalysis<Info,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap> *)
             local_a0,wasm,(Func *)&analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  __dest = &analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  _Function_handler<void_(wasm::Function_*,_Info_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/module-utils.h:447:48)>
  ::_M_manager((_Any_data *)__dest,(_Any_data *)__dest,__destroy_functor);
  std::
  _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_Info>,_std::_Select1st<std::pair<wasm::Function_*const,_Info>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
  ::swap(&(this->map)._M_t,
         (_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_Info>,_std::_Select1st<std::pair<wasm::Function_*const,_Info>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
          *)&analysis);
  pFVar4 = (Function *)(this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pFVar4 != local_38) {
    do {
      p_Var3 = *(_Rb_tree_node_base **)&pFVar4->profile;
      ppcVar1 = &(pFVar4->super_Importable).base.super_IString.str._M_str;
      target = pFVar4;
      if (p_Var3 != (_Rb_tree_node_base *)ppcVar1) {
        do {
          local_48 = *(key_type *)(p_Var3 + 1);
          pmVar2 = std::
                   map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                   ::operator[](&this->map,&local_48);
          std::
          _Rb_tree<wasm::Function*,wasm::Function*,std::_Identity<wasm::Function*>,std::less<wasm::Function*>,std::allocator<wasm::Function*>>
          ::_M_insert_unique<wasm::Function*const&>
                    ((_Rb_tree<wasm::Function*,wasm::Function*,std::_Identity<wasm::Function*>,std::less<wasm::Function*>,std::allocator<wasm::Function*>>
                      *)&(pmVar2->super_FunctionInfo).calledBy,
                     (Function **)&(pFVar4->super_Importable).module.super_IString.str._M_str);
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
        } while (p_Var3 != (_Rb_tree_node_base *)ppcVar1);
      }
      pFVar4 = (Function *)std::_Rb_tree_increment((_Rb_tree_node_base *)target);
    } while (pFVar4 != local_38);
  }
  std::
  _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_Info>,_std::_Select1st<std::pair<wasm::Function_*const,_Info>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_Info>,_std::_Select1st<std::pair<wasm::Function_*const,_Info>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
               *)&analysis);
  return;
}

Assistant:

CallGraphPropertyAnalysis(Module& wasm, Func work) : wasm(wasm) {
    ParallelFunctionAnalysis<T> analysis(wasm, [&](Function* func, T& info) {
      work(func, info);
      if (func->imported()) {
        return;
      }
      struct Mapper : public PostWalker<Mapper> {
        Mapper(Module* module, T& info, Func work)
          : module(module), info(info), work(work) {}

        void visitCall(Call* curr) {
          info.callsTo.insert(module->getFunction(curr->target));
        }
        void visitCallIndirect(CallIndirect* curr) {
          info.hasNonDirectCall = true;
        }
        void visitCallRef(CallRef* curr) { info.hasNonDirectCall = true; }

      private:
        Module* module;
        T& info;
        Func work;
      } mapper(&wasm, info, work);
      mapper.walk(func->body);
    });

    map.swap(analysis.map);

    // Find what is called by what.
    for (auto& [func, info] : map) {
      for (auto* target : info.callsTo) {
        map[target].calledBy.insert(func);
      }
    }
  }